

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

void __thiscall
Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::ArenaAllocatorBase
          (ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL> *this,
          LPCWSTR name,PageAllocator *pageAllocator,_func_void *outOfMemoryFunc,
          _func_void *recoverMemoryFunc)

{
  _func_void *recoverMemoryFunc_local;
  _func_void *outOfMemoryFunc_local;
  PageAllocator *pageAllocator_local;
  LPCWSTR name_local;
  ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL> *this_local;
  
  Memory::Allocator::Allocator(&this->super_Allocator,outOfMemoryFunc,recoverMemoryFunc);
  ArenaData::ArenaData(&this->super_ArenaData,pageAllocator);
  TaggedPointer<char>::TaggedPointer(&this->cacheBlockEnd,(char *)0x0);
  this->largestHole = 0;
  this->blockState = 0;
  this->freeListSize = 0;
  this->freeList = (void *)0x0;
  this->name = name;
  LogBegin(this);
  this->needsDelayFreeList = false;
  ArenaMemoryTracking::ArenaCreated(&this->super_Allocator,name);
  return;
}

Assistant:

ArenaAllocatorBase<TFreeListPolicy, ObjectAlignmentBitShiftArg, RequireObjectAlignment, MaxObjectSize>::
ArenaAllocatorBase(__in LPCWSTR name, PageAllocator * pageAllocator, void(*outOfMemoryFunc)(), void(*recoverMemoryFunc)()) :
    Allocator(outOfMemoryFunc, recoverMemoryFunc),
    ArenaData(pageAllocator),
#ifdef ARENA_ALLOCATOR_FREE_LIST_SIZE
    freeListSize(0),
#endif
    freeList(nullptr),
    largestHole(0),
    cacheBlockEnd(nullptr),
    blockState(0)
{
#ifdef PROFILE_MEM
    this->name = name;
    LogBegin();
#endif
#if DBG
    needsDelayFreeList = false;
#endif
    ArenaMemoryTracking::ArenaCreated(this, name);
}